

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::MeshLoader::begin__triangles
          (MeshLoader *this,triangles__AttributeData *attributeData)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  MaterialId val;
  long in_RSI;
  char *in_RDI;
  UniqueId *in_stack_ffffffffffffff28;
  String *material;
  Triangles *in_stack_ffffffffffffff30;
  MeshPrimitive *pMVar1;
  IFilePartLoader *in_stack_ffffffffffffff38;
  ArrayPrimitiveType<unsigned_int> *in_stack_ffffffffffffff40;
  GeometryMaterialIdInfo *this_01;
  allocator<char> *__a;
  allocator<char> local_81;
  string local_80 [39];
  allocator<char> local_59;
  string local_58 [35];
  undefined1 local_35;
  UniqueId local_28;
  long local_10;
  
  in_RDI[0x240] = '\x01';
  in_RDI[0x241] = '\0';
  in_RDI[0x242] = '\0';
  in_RDI[0x243] = '\0';
  local_10 = in_RSI;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x118)
  ;
  local_35 = 1;
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)520>::ID();
  IFilePartLoader::createUniqueId
            (in_stack_ffffffffffffff38,(ClassId)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  COLLADAFW::Triangles::Triangles(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_35 = 0;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0xd0) = this_00;
  COLLADAFW::UniqueId::~UniqueId(&local_28);
  if (*(long *)(local_10 + 0x10) != 0) {
    COLLADAFW::MeshPrimitive::getPositionIndices(*(MeshPrimitive **)(in_RDI + 0xd0));
    COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
              (in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    if ((in_RDI[0x1ec] & 1U) != 0) {
      COLLADAFW::MeshPrimitive::getNormalIndices(*(MeshPrimitive **)(in_RDI + 0xd0));
      COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
                (in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    }
    if ((in_RDI[0x1fc] & 1U) != 0) {
      COLLADAFW::MeshPrimitive::getTangentIndices(*(MeshPrimitive **)(in_RDI + 0xd0));
      COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
                (in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    }
    if ((in_RDI[0x20c] & 1U) != 0) {
      COLLADAFW::MeshPrimitive::getBinormalIndices(*(MeshPrimitive **)(in_RDI + 0xd0));
      COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
                (in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    }
  }
  if (*(long *)(local_10 + 0x18) != 0) {
    pMVar1 = *(MeshPrimitive **)(in_RDI + 0xd0);
    this_01 = *(GeometryMaterialIdInfo **)(local_10 + 0x18);
    __a = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,__a);
    val = GeometryMaterialIdInfo::getMaterialId(this_01,(String *)pMVar1);
    COLLADAFW::MeshPrimitive::setMaterialId(pMVar1,val);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    material = *(String **)(in_RDI + 0xd0);
    pMVar1 = *(MeshPrimitive **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDI,__a);
    COLLADAFW::MeshPrimitive::setMaterial(pMVar1,material);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return true;
}

Assistant:

bool MeshLoader::begin__triangles( const triangles__AttributeData& attributeData )
	{
		mCurrentPrimitiveType = TRIANGLES;
		mCurrentMeshPrimitive = new COLLADAFW::Triangles(createUniqueId(COLLADAFW::Triangles::ID()));
		if ( (size_t)attributeData.count > 0)
		{
			mCurrentMeshPrimitive->getPositionIndices().reallocMemory((size_t)attributeData.count);
			if ( mUseNormals )
			{
				mCurrentMeshPrimitive->getNormalIndices().reallocMemory((size_t)attributeData.count);
			}

            if ( mUseTangents )
            {
                mCurrentMeshPrimitive->getTangentIndices().reallocMemory((size_t)attributeData.count);
            }

            if ( mUseBinormals )
            {
                mCurrentMeshPrimitive->getBinormalIndices().reallocMemory((size_t)attributeData.count);
            }

			// TODO pre-alloc memory for uv indices
		}
		if ( attributeData.material )
		{
			mCurrentMeshPrimitive->setMaterialId(mMaterialIdInfo.getMaterialId(attributeData.material));
			mCurrentMeshPrimitive->setMaterial(attributeData.material);
		}
		return true;
	}